

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O3

void __thiscall settings::setup(settings *this,value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  base_cache *tmp;
  value *v_00;
  runtime_error *prVar6;
  session_file_storage_factory *__p;
  session_memory_storage_factory *this_00;
  undefined8 uVar7;
  session_storage_factory *__p_00;
  long *plVar8;
  size_type *psVar9;
  _Alloc_hider _Var10;
  string so;
  string error;
  string stor;
  string module;
  string entry_point;
  cppcms_session_storage_generator_type f;
  undefined1 local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cppcms::json::value::get_abi_cxx11_(&local_110,v,"ip","0.0.0.0");
  std::__cxx11::string::operator=((string *)this,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  v_00 = (value *)cppcms::json::value::at((char *)v);
  iVar4 = cppcms::json::traits<int>::get(v_00);
  this->port = iVar4;
  local_110._M_dataplus._M_p._0_4_ = std::thread::hardware_concurrency();
  uVar5 = cppcms::json::value::get<unsigned_int>(v,"threads",(uint *)&local_110);
  this->threads = uVar5;
  local_110._M_dataplus._M_p._0_4_ = 0xffffffff;
  iVar4 = cppcms::json::value::get<int>(v,"cache.limit",(int *)&local_110);
  if (iVar4 != -1) {
    cppcms::impl::thread_cache_factory((uint)(intrusive_ptr<cppcms::impl::base_cache> *)local_150);
    uVar7 = local_150._0_8_;
    local_150._0_8_ = (base_cache *)0x0;
    local_110._M_dataplus._M_p = (pointer)(this->cache).p_;
    (this->cache).p_ = (base_cache *)uVar7;
    booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::base_cache> *)&local_110);
    booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::base_cache> *)local_150);
  }
  local_110._M_dataplus._M_p._0_4_ = 10;
  iVar4 = cppcms::json::value::get<int>(v,"session.gc",(int *)&local_110);
  this->gc = iVar4;
  cppcms::json::value::get_abi_cxx11_(&local_110,v,"session.storage","");
  if (local_110._M_string_length == 0) goto LAB_00105fff;
  iVar4 = std::__cxx11::string::compare((char *)&local_110);
  if (iVar4 == 0) {
    cppcms::json::value::get_abi_cxx11_((string *)local_150,v,"session.dir","");
    __p = (session_file_storage_factory *)operator_new(0x18);
    local_70[0] = &local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_150._0_8_,(base_cache *)(local_150._0_8_ + local_150._8_8_))
    ;
    cppcms::sessions::session_file_storage_factory::session_file_storage_factory
              (__p,local_70,this->threads,1,0);
    std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::sessions::session_file_storage_factory>
              (&(this->sessions).
                super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
               ,__p);
    _Var10._M_p = (pointer)local_70[0];
    if (local_70[0] != &local_60) {
LAB_00105fe7:
      operator_delete(_Var10._M_p);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_110);
    if (iVar4 == 0) {
      this_00 = (session_memory_storage_factory *)operator_new(0x18);
      cppcms::sessions::session_memory_storage_factory::session_memory_storage_factory(this_00);
      std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
      reset<cppcms::sessions::session_memory_storage_factory>
                (&(this->sessions).
                  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                 ,this_00);
      goto LAB_00105fff;
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_110);
    if (iVar4 != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     "Unknown session.storage:",&local_110);
      booster::runtime_error::runtime_error(prVar6,(string *)local_150);
      *(undefined ***)prVar6 = &PTR__runtime_error_0010ac18;
      (prVar6->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010ac40;
      __cxa_throw(prVar6,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    cppcms::json::value::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,v,
               "session.shared_object",&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    paVar2 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    cppcms::json::value::get<std::__cxx11::string>(&local_f0,v,"session.module",&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    paVar1 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"sessions_generator","");
    cppcms::json::value::get<std::__cxx11::string>(&local_d0,v,"session.entry_point",&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_150._8_8_ == 0) {
      if (local_f0._M_string_length == 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_130._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "session.storage=external and neither session.shared_object nor session.module is defined"
                   ,"");
        booster::runtime_error::runtime_error(prVar6,&local_130);
        *(undefined ***)prVar6 = &PTR__runtime_error_0010ac18;
        (prVar6->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010ac40;
        __cxa_throw(prVar6,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      booster::shared_object::name((string *)&local_130);
      std::__cxx11::string::operator=((string *)local_150,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
    else if (local_f0._M_string_length != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"both session.shared_object and session.module are defined",""
                );
      booster::runtime_error::runtime_error(prVar6,&local_130);
      *(undefined ***)prVar6 = &PTR__runtime_error_0010ac18;
      (prVar6->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010ac40;
      __cxa_throw(prVar6,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)paVar1;
    cVar3 = booster::shared_object::open((string *)&this->plugin,(string *)local_150);
    if (cVar3 == '\0') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::operator+(&local_50,"sessions_pool: failed to load shared object ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150)
      ;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
      psVar9 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar9) {
        local_b0.field_2._M_allocated_capacity = *psVar9;
        local_b0.field_2._8_8_ = plVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar9;
      }
      local_b0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::operator+(&local_90,&local_b0,&local_130);
      booster::runtime_error::runtime_error(prVar6,&local_90);
      *(undefined ***)prVar6 = &PTR__runtime_error_0010ac18;
      (prVar6->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010ac40;
      __cxa_throw(prVar6,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_90._M_dataplus._M_p = (pointer)0x0;
    booster::shared_object::
    symbol<cppcms::sessions::session_storage_factory*(*)(cppcms::json::value_const&)>
              (&this->plugin,(_func_session_storage_factory_ptr_value_ptr **)&local_90,&local_d0);
    _Var10._M_p = local_90._M_dataplus._M_p;
    uVar7 = cppcms::json::value::find((char *)v);
    __p_00 = (session_storage_factory *)(*(code *)_Var10._M_p)(uVar7);
    std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::sessions::session_storage_factory>
              (&(this->sessions).
                super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
               ,__p_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    _Var10._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_00105fe7;
  }
  if ((base_cache *)local_150._0_8_ != (base_cache *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_);
  }
LAB_00105fff:
  if ((this->cache).p_ == (base_cache *)0x0 &&
      (this->sessions).
      super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_150._0_8_ = local_150 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"Neither cache.limit nor session.storage is defined","");
    booster::runtime_error::runtime_error(prVar6,(string *)local_150);
    *(undefined ***)prVar6 = &PTR__runtime_error_0010ac18;
    (prVar6->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010ac40;
    __cxa_throw(prVar6,&cppcms::cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  return;
}

Assistant:

void setup(cppcms::json::value const &v)
	{		
		ip=v.get("ip","0.0.0.0");
		port=v.get<int>("port");
		threads=v.get("threads",booster::thread::hardware_concurrency());
		int items = v.get("cache.limit",-1);
		if(items!=-1){
			cache = cppcms::impl::thread_cache_factory(items);
		}
		gc=v.get("session.gc",10);
		std::string stor = v.get("session.storage","");
		if(!stor.empty()) {
			#ifndef CPPCMS_NO_GZIP
			if(stor == "files") {
				std::string dir = v.get("session.dir","");
				#ifdef CPPCMS_WIN_NATIVE
				sessions.reset(new cppcms::sessions::session_file_storage_factory(dir));
				#else
				sessions.reset(new cppcms::sessions::session_file_storage_factory(dir,threads,1,false));
				#endif
			}
			else 
			#endif //CPPCMS_NO_GZIP
            if(stor == "memory") {
				sessions.reset(new cppcms::sessions::session_memory_storage_factory());
			}
			else if(stor == "external") {
				std::string so = v.get<std::string>("session.shared_object","");
				std::string module = v.get<std::string>("session.module","");
				std::string entry_point = v.get<std::string>("session.entry_point","sessions_generator");
				if(so.empty() && module.empty())
					throw cppcms::cppcms_error(
								"session.storage=external "
								"and neither session.shared_object "
								"nor session.module is defined");
				if(!so.empty() && !module.empty())
					throw cppcms::cppcms_error(
								"both session.shared_object "
								"and session.module are defined");

				if(so.empty()) {
					so = booster::shared_object::name(module);
				}
				std::string error;
				if(!plugin.open(so,error)) {
					throw cppcms::cppcms_error("sessions_pool: failed to load shared object " + so + ": " + error);
				}
				cppcms::sessions::cppcms_session_storage_generator_type f=0;
				plugin.symbol(f,entry_point);
				sessions.reset(f(v.find("session.settings")));
			}
			else 
				throw cppcms::cppcms_error("Unknown session.storage:"+stor);
		}
		if(!sessions && !cache) {
			throw cppcms::cppcms_error("Neither cache.limit nor session.storage is defined");
		}
	}